

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

ssize_t filemgr_read_block(filemgr *file,void *buf,bid_t bid)

{
  fdb_status fVar1;
  size_t blocksize;
  size_t sVar2;
  
  blocksize = (*file->ops->pread)(file->fd,buf,(ulong)file->blocksize,file->blocksize * bid);
  sVar2 = blocksize;
  if ((((0 < (long)blocksize) && ((file->encryption).ops != (encryption_ops *)0x0)) &&
      (sVar2 = 0xfffffffffffffffb, blocksize == file->blocksize)) &&
     (fVar1 = fdb_decrypt_block(&file->encryption,buf,blocksize,bid), sVar2 = blocksize,
     fVar1 != FDB_RESULT_SUCCESS)) {
    sVar2 = (long)fVar1;
  }
  return sVar2;
}

Assistant:

static ssize_t filemgr_read_block(struct filemgr *file, void *buf, bid_t bid) {
    ssize_t result = file->ops->pread(file->fd, buf, file->blocksize,
                                      file->blocksize*bid);
    if (file->encryption.ops && result > 0) {
        if (result != (ssize_t)file->blocksize)
            return FDB_RESULT_READ_FAIL;
        fdb_status status = fdb_decrypt_block(&file->encryption, buf, result, bid);
        if (status != FDB_RESULT_SUCCESS)
            return status;
    }
    return result;
}